

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void base64_encode_binary(uchar *in,char *out,int len)

{
  uchar uVar1;
  char *pcVar2;
  int iVar3;
  char *__ptr;
  uint local_48;
  uchar *o;
  unsigned_long olen;
  int rem;
  int pos;
  int i;
  int len_local;
  char *out_local;
  uchar *in_local;
  
  pos = len;
  _i = out;
  out_local = (char *)in;
  o = (uchar *)compressBound((long)len);
  __ptr = (char *)malloc((size_t)o);
  iVar3 = compress2(__ptr,&o,out_local,(long)pos,9);
  if (iVar3 == 0) {
    olen._4_4_ = sprintf(_i,"$%d$",(ulong)(uint)pos);
    pcVar2 = __ptr;
    if ((uchar *)(long)pos <= o + olen._4_4_) {
      olen._4_4_ = 0;
      o = (uchar *)(long)pos;
      pcVar2 = out_local;
    }
    out_local = pcVar2;
    for (rem = 0; (ulong)(long)rem < ((ulong)o / 3) * 3; rem = rem + 3) {
      _i[olen._4_4_] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(int)(uint)(byte)out_local[rem] >> 2];
      _i[olen._4_4_ + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(int)(((byte)out_local[rem] & 3) << 4 | (int)((byte)out_local[rem + 1] & 0xf0) >> 4)];
      _i[olen._4_4_ + 2] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(int)(((byte)out_local[rem + 1] & 0xf) << 2 |
                 (int)((byte)out_local[rem + 2] & 0xc0) >> 6)];
      _i[olen._4_4_ + 3] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(int)((byte)out_local[rem + 2] & 0x3f)];
      olen._4_4_ = olen._4_4_ + 4;
    }
    olen._0_4_ = (int)o - rem;
    if (0 < (int)olen) {
      _i[olen._4_4_] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(int)(uint)(byte)out_local[rem] >> 2];
      if ((int)olen == 1) {
        local_48 = 0;
      }
      else {
        local_48 = (int)((byte)out_local[rem + 1] & 0xf0) >> 4;
      }
      _i[olen._4_4_ + 1] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(int)(((byte)out_local[rem] & 3) << 4 | local_48)];
      if ((int)olen == 1) {
        uVar1 = '=';
      }
      else {
        uVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(int)(((byte)out_local[rem + 1] & 0xf) << 2)];
      }
      _i[olen._4_4_ + 2] = uVar1;
      _i[olen._4_4_ + 3] = '=';
      olen._4_4_ = olen._4_4_ + 4;
    }
    free(__ptr);
    _i[olen._4_4_] = '\0';
    return;
  }
  panic("Could not compress input data!");
}

Assistant:

static void base64_encode_binary(const unsigned char* in, char *out, int len)
{
    int i, pos, rem;
    unsigned long olen = compressBound(len);
    unsigned char *o = malloc(olen);

    if (compress2(o, &olen, in, len, Z_BEST_COMPRESSION) != Z_OK)
	panic("Could not compress input data!");

    pos = sprintf(out, "$%d$", len);
    if (pos + olen >= len) {
	pos = 0;
	olen = len;
    } else {
	in = o;
    }

    for (i = 0; i < (olen / 3) * 3; i += 3) {
	out[pos  ] = b64e[ in[i  ]         >> 2];
	out[pos+1] = b64e[(in[i  ] & 0x03) << 4 | (in[i+1] & 0xf0) >> 4];
	out[pos+2] = b64e[(in[i+1] & 0x0f) << 2 | (in[i+2] & 0xc0) >> 6];
	out[pos+3] = b64e[ in[i+2] & 0x3f];
	pos += 4;
    }

    rem = olen - i;
    if (rem > 0) {
	out[pos  ] = b64e[ in[i  ]         >> 2];
	out[pos+1] = b64e[(in[i  ] & 0x03) << 4 |
			 (rem == 1 ? 0 :
			  (in[i+1] & 0xf0) >> 4)];
	out[pos+2] = (rem == 1) ? '=' :
		     b64e[(in[i+1] & 0x0f) << 2];
	out[pos+3] = '=';
	pos += 4;
    }

    free(o);

    out[pos] = '\0';
}